

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_DoubleSSLError_Test::TestBody
          (SSLVersionTest_DoubleSSLError_Test *this)

{
  bool bVar1;
  int ret_code;
  char *pcVar2;
  BIO_METHOD *__p;
  pointer pbVar3;
  _func_int_BIO_ptr_char_ptr_int *p_Var4;
  _func_long_BIO_ptr_int_long_void_ptr *ctrl_func;
  BIO_METHOD *pBVar5;
  BIO *pBVar6;
  pointer pbVar7;
  pointer psVar8;
  pointer psVar9;
  SSL *pSVar10;
  BIO *pBVar11;
  _func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *callback;
  ulong uVar12;
  char *in_R9;
  bool local_4d5;
  string local_3d8;
  AssertHelper local_3b8;
  Message local_3b0;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__10;
  int server_err;
  int server_ret;
  AssertHelper local_368;
  Message local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__9;
  Message local_340;
  int local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar;
  int client_err;
  int client_ret;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<SSL> server_outer;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<SSL> client_outer;
  AssertHelper local_260;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<BIO> server_bio;
  AssertHelper local_218;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<BIO> client_bio;
  AssertHelper local_1d0;
  Message local_1c8;
  __2 local_1bd;
  int local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_188;
  Message local_180;
  __1 local_175;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_140;
  Message local_138;
  __0 local_12d;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIO_METHOD> bio_method;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0 [3];
  ClientConfig local_88;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  SSLVersionTest_DoubleSSLError_Test *this_local;
  
  local_88.verify_hostname.field_2._M_allocated_capacity = 0;
  local_88.verify_hostname.field_2._8_8_ = 0;
  local_88.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
  local_88.verify_hostname._1_7_ = 0;
  local_88.verify_hostname._M_string_length = 0;
  local_88.servername.field_2._M_allocated_capacity = 0;
  local_88.servername.field_2._8_8_ = 0;
  local_88.servername._M_dataplus = (_Alloc_hider)0x0;
  local_88.servername._1_7_ = 0;
  local_88.servername._M_string_length = 0;
  local_88.session = (SSL_SESSION *)0x0;
  local_88.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
  local_88.hostflags = 0;
  local_88.early_data = false;
  local_88._85_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ClientConfig::ClientConfig(&local_88);
  local_21 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_88);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  ClientConfig::~ClientConfig(&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_20,(AssertionResult *)"Connect()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x2032,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (bVar1) {
    __p = BIO_meth_new(0,(char *)0x0);
    std::unique_ptr<bio_method_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bio_method_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,__p);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<bio_method_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_e8,
               (unique_ptr<bio_method_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_e8,
                 (AssertionResult *)"bio_method","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x2036,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    if (bVar1) {
      pbVar3 = std::unique_ptr<bio_method_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<bio_method_st,_bssl::internal::Deleter> *)
                          &gtest_ar__1.message_);
      p_Var4 = (anonymous_namespace)::SSLVersionTest_DoubleSSLError_Test::TestBody()::$_0::
               operator_cast_to_function_pointer(&local_12d);
      local_12c = BIO_meth_set_read(pbVar3,p_Var4);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_128,&local_12c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_128,
                   (AssertionResult *)
                   "BIO_meth_set_read( bio_method.get(), [](BIO *bio, char *out, int len) -> int { SSL *ssl = static_cast<SSL *>(BIO_get_data(bio)); int ret = SSL_read(ssl, out, len); int ssl_ret = SSL_get_error(ssl, ret); if (ssl_ret == 2) { BIO_set_retry_read(bio); } return ret; })"
                   ,"false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x2040,pcVar2);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_138);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      if (bVar1) {
        pbVar3 = std::unique_ptr<bio_method_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bio_method_st,_bssl::internal::Deleter> *)
                            &gtest_ar__1.message_);
        p_Var4 = (anonymous_namespace)::SSLVersionTest_DoubleSSLError_Test::TestBody()::$_1::
                 operator_cast_to_function_pointer(&local_175);
        local_174 = BIO_meth_set_write(pbVar3,p_Var4);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_170,&local_174,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
        if (!bVar1) {
          testing::Message::Message(&local_180);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_170,
                     (AssertionResult *)
                     "BIO_meth_set_write( bio_method.get(), [](BIO *bio, const char *in, int len) -> int { SSL *ssl = static_cast<SSL *>(BIO_get_data(bio)); int ret = SSL_write(ssl, in, len); int ssl_ret = SSL_get_error(ssl, ret); if (ssl_ret == 3) { BIO_set_retry_write(bio); } return ret; })"
                     ,"false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x204a,pcVar2);
          testing::internal::AssertHelper::operator=(&local_188,&local_180);
          testing::internal::AssertHelper::~AssertHelper(&local_188);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_180);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
        if (bVar1) {
          pbVar3 = std::unique_ptr<bio_method_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bio_method_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          ctrl_func = (anonymous_namespace)::SSLVersionTest_DoubleSSLError_Test::TestBody()::$_2::
                      operator_cast_to_function_pointer(&local_1bd);
          local_1bc = BIO_meth_set_ctrl(pbVar3,ctrl_func);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1b8,&local_1bc,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
          if (!bVar1) {
            testing::Message::Message(&local_1c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&client_bio,(internal *)local_1b8,
                       (AssertionResult *)
                       "BIO_meth_set_ctrl( bio_method.get(), [](BIO *bio, int cmd, long larg, void *parg) -> long { if (cmd == 11) { return 1; } return 0; })"
                       ,"false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2052,pcVar2);
            testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
            testing::internal::AssertHelper::~AssertHelper(&local_1d0);
            std::__cxx11::string::~string((string *)&client_bio);
            testing::Message::~Message(&local_1c8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
          if (bVar1) {
            pBVar5 = (BIO_METHOD *)
                     std::unique_ptr<bio_method_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_method_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            pBVar6 = BIO_new(pBVar5);
            std::unique_ptr<bio_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       (pointer)pBVar6);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_208,
                       (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
            if (!bVar1) {
              testing::Message::Message(&local_210);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&server_bio,(internal *)local_208,(AssertionResult *)"client_bio"
                         ,"false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_218,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x2055,pcVar2);
              testing::internal::AssertHelper::operator=(&local_218,&local_210);
              testing::internal::AssertHelper::~AssertHelper(&local_218);
              std::__cxx11::string::~string((string *)&server_bio);
              testing::Message::~Message(&local_210);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
            if (bVar1) {
              pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__5.message_);
              psVar8 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).client_);
              BIO_set_data(pbVar7,psVar8);
              pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__5.message_);
              BIO_set_init(pbVar7,1);
              pBVar5 = (BIO_METHOD *)
                       std::unique_ptr<bio_method_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bio_method_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
              pBVar6 = BIO_new(pBVar5);
              std::unique_ptr<bio_st,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__6.message_,
                         (pointer)pBVar6);
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_250,
                         (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                         (type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
              if (!bVar1) {
                testing::Message::Message(&local_258);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&client_outer,(internal *)local_250,
                           (AssertionResult *)"server_bio","false","true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_260,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x205a,pcVar2);
                testing::internal::AssertHelper::operator=(&local_260,&local_258);
                testing::internal::AssertHelper::~AssertHelper(&local_260);
                std::__cxx11::string::~string((string *)&client_outer);
                testing::Message::~Message(&local_258);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
              if (bVar1) {
                pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__6.message_);
                psVar8 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_);
                BIO_set_data(pbVar7,psVar8);
                pbVar7 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__6.message_);
                BIO_set_init(pbVar7,1);
                psVar9 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_ctx_);
                pSVar10 = SSL_new((SSL_CTX *)psVar9);
                std::unique_ptr<ssl_st,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           (pointer)pSVar10);
                testing::AssertionResult::
                AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
                          ((AssertionResult *)local_298,
                           (unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           (type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_298);
                if (!bVar1) {
                  testing::Message::Message(&local_2a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&server_outer,(internal *)local_298,
                             (AssertionResult *)"client_outer","false","true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2a8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2060,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
                  testing::internal::AssertHelper::~AssertHelper(&local_2a8);
                  std::__cxx11::string::~string((string *)&server_outer);
                  testing::Message::~Message(&local_2a0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
                if (bVar1) {
                  pSVar10 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__7.message_);
                  SSL_set_connect_state(pSVar10);
                  pSVar10 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__7.message_);
                  pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                             &gtest_ar__5.message_);
                  pBVar11 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__5.message_);
                  SSL_set_bio(pSVar10,pBVar6,pBVar11);
                  std::unique_ptr<bio_st,_bssl::internal::Deleter>::release
                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
                  psVar9 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).server_ctx_);
                  pSVar10 = SSL_new((SSL_CTX *)psVar9);
                  std::unique_ptr<ssl_st,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar__8.message_,
                             (pointer)pSVar10);
                  testing::AssertionResult::
                  AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
                            ((AssertionResult *)local_2e0,
                             (unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_,
                             (type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2e0);
                  if (!bVar1) {
                    testing::Message::Message(&local_2e8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&client_ret,(internal *)local_2e0,
                               (AssertionResult *)"server_outer","false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2f0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x2066,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
                    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
                    std::__cxx11::string::~string((string *)&client_ret);
                    testing::Message::~Message(&local_2e8);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
                  if (bVar1) {
                    pSVar10 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__8.message_);
                    SSL_set_accept_state(pSVar10);
                    pSVar10 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__8.message_);
                    pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                              ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                               &gtest_ar__6.message_);
                    pBVar11 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__6.message_);
                    SSL_set_bio(pSVar10,pBVar6,pBVar11);
                    std::unique_ptr<bio_st,_bssl::internal::Deleter>::release
                              ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_)
                    ;
                    psVar8 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__7.message_);
                    callback = (anonymous_namespace)::SSLVersionTest_DoubleSSLError_Test::TestBody()
                               ::$_3::operator_cast_to_function_pointer
                                         ((__3 *)((long)&client_err + 3));
                    SSL_set_custom_verify(psVar8,1,callback);
                    do {
                      pSVar10 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__7.message_);
                      ret_code = SSL_do_handshake(pSVar10);
                      pSVar10 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__7.message_);
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ = SSL_get_error(pSVar10,ret_code);
                      if ((gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_ != 2) &&
                         (gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ != 3)) {
                        local_334 = 1;
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_330,"1","client_err",&local_334,
                                   (int *)((long)&gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          + 4));
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_330);
                        if (!bVar1) {
                          testing::Message::Message(&local_340);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_330);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x2079,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__9.message_,&local_340);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__9.message_);
                          testing::Message::~Message(&local_340);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
                        uVar12 = ERR_peek_error();
                        ErrorEquals((uint32_t)local_358,(int)uVar12,0x10);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_358);
                        if (!bVar1) {
                          testing::Message::Message(&local_360);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&server_err,(internal *)local_358,
                                     (AssertionResult *)
                                     "ErrorEquals(ERR_peek_error(), ERR_LIB_SSL, 125)","false",
                                     "true",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_368,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x207b,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_368,&local_360);
                          testing::internal::AssertHelper::~AssertHelper(&local_368);
                          std::__cxx11::string::~string((string *)&server_err);
                          testing::Message::~Message(&local_360);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
                        break;
                      }
                      pSVar10 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__8.message_);
                      gtest_ar__10.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ = SSL_do_handshake(pSVar10);
                      pSVar10 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__8.message_);
                      gtest_ar__10.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._0_4_ =
                           SSL_get_error(pSVar10,gtest_ar__10.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._4_4_);
                      local_4d5 = true;
                      if (((int)gtest_ar__10.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl != 0) &&
                         (local_4d5 = true,
                         (int)gtest_ar__10.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl != 2)) {
                        local_4d5 = (int)gtest_ar__10.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl == 3;
                      }
                      local_3a1 = local_4d5;
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_3a0);
                      if (!bVar1) {
                        testing::Message::Message(&local_3b0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_3d8,(internal *)local_3a0,
                                   (AssertionResult *)
                                   "server_err == 0 || server_err == 2 || server_err == 3","false",
                                   "true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3b8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x2084,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
                        testing::internal::AssertHelper::~AssertHelper(&local_3b8);
                        std::__cxx11::string::~string((string *)&local_3d8);
                        testing::Message::~Message(&local_3b0);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
                    } while (bVar1);
                  }
                  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_);
                }
                std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_);
              }
              std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
            }
            std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
          }
        }
      }
    }
    std::unique_ptr<bio_method_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bio_method_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, DoubleSSLError) {
  // Connect the inner SSL connections.
  ASSERT_TRUE(Connect());

  // Make a pair of |BIO|s which wrap |client_| and |server_|.
  UniquePtr<BIO_METHOD> bio_method(BIO_meth_new(0, nullptr));
  ASSERT_TRUE(bio_method);
  ASSERT_TRUE(BIO_meth_set_read(
      bio_method.get(), [](BIO *bio, char *out, int len) -> int {
        SSL *ssl = static_cast<SSL *>(BIO_get_data(bio));
        int ret = SSL_read(ssl, out, len);
        int ssl_ret = SSL_get_error(ssl, ret);
        if (ssl_ret == SSL_ERROR_WANT_READ) {
          BIO_set_retry_read(bio);
        }
        return ret;
      }));
  ASSERT_TRUE(BIO_meth_set_write(
      bio_method.get(), [](BIO *bio, const char *in, int len) -> int {
        SSL *ssl = static_cast<SSL *>(BIO_get_data(bio));
        int ret = SSL_write(ssl, in, len);
        int ssl_ret = SSL_get_error(ssl, ret);
        if (ssl_ret == SSL_ERROR_WANT_WRITE) {
          BIO_set_retry_write(bio);
        }
        return ret;
      }));
  ASSERT_TRUE(BIO_meth_set_ctrl(
      bio_method.get(), [](BIO *bio, int cmd, long larg, void *parg) -> long {
        // |SSL| objects require |BIO_flush| support.
        if (cmd == BIO_CTRL_FLUSH) {
          return 1;
        }
        return 0;
      }));

  UniquePtr<BIO> client_bio(BIO_new(bio_method.get()));
  ASSERT_TRUE(client_bio);
  BIO_set_data(client_bio.get(), client_.get());
  BIO_set_init(client_bio.get(), 1);

  UniquePtr<BIO> server_bio(BIO_new(bio_method.get()));
  ASSERT_TRUE(server_bio);
  BIO_set_data(server_bio.get(), server_.get());
  BIO_set_init(server_bio.get(), 1);

  // Wrap the inner connections in another layer of SSL.
  UniquePtr<SSL> client_outer(SSL_new(client_ctx_.get()));
  ASSERT_TRUE(client_outer);
  SSL_set_connect_state(client_outer.get());
  SSL_set_bio(client_outer.get(), client_bio.get(), client_bio.get());
  client_bio.release();  // |SSL_set_bio| takes ownership.

  UniquePtr<SSL> server_outer(SSL_new(server_ctx_.get()));
  ASSERT_TRUE(server_outer);
  SSL_set_accept_state(server_outer.get());
  SSL_set_bio(server_outer.get(), server_bio.get(), server_bio.get());
  server_bio.release();  // |SSL_set_bio| takes ownership.

  // Configure |client_outer| to reject the server certificate.
  SSL_set_custom_verify(
      client_outer.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) -> ssl_verify_result_t {
        return ssl_verify_invalid;
      });

  for (;;) {
    int client_ret = SSL_do_handshake(client_outer.get());
    int client_err = SSL_get_error(client_outer.get(), client_ret);
    if (client_err != SSL_ERROR_WANT_READ &&
        client_err != SSL_ERROR_WANT_WRITE) {
      // The client handshake should terminate on a certificate verification
      // error.
      EXPECT_EQ(SSL_ERROR_SSL, client_err);
      EXPECT_TRUE(ErrorEquals(ERR_peek_error(), ERR_LIB_SSL,
                              SSL_R_CERTIFICATE_VERIFY_FAILED));
      break;
    }

    // Run the server handshake and continue.
    int server_ret = SSL_do_handshake(server_outer.get());
    int server_err = SSL_get_error(server_outer.get(), server_ret);
    ASSERT_TRUE(server_err == SSL_ERROR_NONE ||
                server_err == SSL_ERROR_WANT_READ ||
                server_err == SSL_ERROR_WANT_WRITE);
  }
}